

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O2

void __thiscall glslang::TShader::TShader(TShader *this,EShLanguage s)

{
  TPoolAllocator *this_00;
  TInfoSink *this_01;
  TCompiler *this_02;
  TIntermediate *this_03;
  
  this->_vptr_TShader = (_func_int **)&PTR__TShader_0089a290;
  this->stage = s;
  this->lengths = (int *)0x0;
  this->stringNames = (char **)0x0;
  this->preamble = "";
  (this->sourceEntryPointName)._M_dataplus._M_p = (pointer)&(this->sourceEntryPointName).field_2;
  (this->sourceEntryPointName)._M_string_length = 0;
  (this->sourceEntryPointName).field_2._M_local_buf[0] = '\0';
  this->overrideVersion = 0;
  this->compileOnly = false;
  this_00 = (TPoolAllocator *)::operator_new(0x60);
  TPoolAllocator::TPoolAllocator(this_00,0x2000,0x10);
  this->pool = this_00;
  this_01 = (TInfoSink *)::operator_new(0x60);
  TInfoSink::TInfoSink(this_01);
  this->infoSink = this_01;
  this_02 = (TCompiler *)::operator_new(0x20);
  TDeferredCompiler::TDeferredCompiler((TDeferredCompiler *)this_02,this->stage,this_01);
  this->compiler = this_02;
  this_03 = (TIntermediate *)::operator_new(0x7e8);
  TIntermediate::TIntermediate(this_03,s,0,ENoProfile);
  this->intermediate = this_03;
  (this->environment).input.languageFamily = EShSourceNone;
  (this->environment).input.dialect = EShClientNone;
  (this->environment).input.vulkanRulesRelaxed = false;
  (this->environment).client.client = EShClientNone;
  (this->environment).target.language = EShTargetNone;
  (this->environment).target.hlslFunctionality1 = false;
  return;
}

Assistant:

TShader::TShader(EShLanguage s)
    : stage(s), lengths(nullptr), stringNames(nullptr), preamble(""), overrideVersion(0)
{
    pool = new TPoolAllocator;
    infoSink = new TInfoSink;
    compiler = new TDeferredCompiler(stage, *infoSink);
    intermediate = new TIntermediate(s);

    // clear environment (avoid constructors in them for use in a C interface)
    environment.input.languageFamily = EShSourceNone;
    environment.input.dialect = EShClientNone;
    environment.input.vulkanRulesRelaxed = false;
    environment.client.client = EShClientNone;
    environment.target.language = EShTargetNone;
    environment.target.hlslFunctionality1 = false;
}